

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O2

Aig_Man_t * Aig_ManConvertBddsToAigs(Aig_Man_t *p,DdManager *dd,Vec_Ptr_t *vCofs)

{
  char *__s;
  Aig_Man_t *p_00;
  size_t sVar1;
  char *__dest;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  st__table *table;
  DdNode *pDVar4;
  DdNode *pDVar5;
  ulong uVar6;
  int iVar7;
  
  Aig_ManCleanData(p);
  p_00 = Aig_ManStart(p->vObjs->nSize - p->nDeleted);
  __s = p->pName;
  iVar7 = 0;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar1 = strlen(__s);
    __dest = (char *)malloc(sVar1 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar7);
    pAVar3 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  table = st__init_table(st__ptrcmp,st__ptrhash);
  pDVar4 = Cudd_ReadOne(dd);
  st__insert(table,(char *)pDVar4,(char *)p_00->pConst1);
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar7);
    pDVar4 = Cudd_bddIthVar(dd,iVar7);
    st__insert(table,(char *)pDVar4,*(char **)((long)pvVar2 + 0x28));
  }
  for (iVar7 = 0; iVar7 < vCofs->nSize; iVar7 = iVar7 + 1) {
    pDVar4 = (DdNode *)Vec_PtrEntry(vCofs,iVar7);
    pDVar5 = Cudd_ReadLogicZero(dd);
    if (pDVar4 != pDVar5) {
      pAVar3 = Aig_NodeBddToMuxes_rec(dd,(DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe),p_00,table);
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)((ulong)((uint)pDVar4 & 1) ^ (ulong)pAVar3));
    }
  }
  st__free_table(table);
  iVar7 = 0;
  do {
    if (p->vCos->nSize <= iVar7) {
      Aig_ManCleanup(p_00);
      Aig_ManSetRegNum(p_00,p->nRegs);
      iVar7 = Aig_ManCheck(p_00);
      if (iVar7 == 0) {
        puts("Aig_ManConvertBddsToAigs(): The check has failed.");
      }
      return p_00;
    }
    pvVar2 = Vec_PtrEntry(p->vCos,iVar7);
    if (iVar7 != 0) {
      Aig_ManDupSimpleDfs_rec
                (p_00,p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe));
      if (((ulong)pvVar2 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      pAVar3 = Aig_ObjCreateCo(p_00,pAVar3);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManConvertBddsToAigs( Aig_Man_t * p, DdManager * dd, Vec_Ptr_t * vCofs )
{
    DdNode * bFunc;
    st__table * tBdd2Node;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanData( p );
    // generate AIG for BDD
    pNew = Aig_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the table mapping BDD nodes into the ABC nodes
    tBdd2Node = st__init_table( st__ptrcmp, st__ptrhash );
    // add the constant and the elementary vars
    st__insert( tBdd2Node, (char *)Cudd_ReadOne(dd), (char *)Aig_ManConst1(pNew) );
    Aig_ManForEachCi( p, pObj, i )
        st__insert( tBdd2Node, (char *)Cudd_bddIthVar(dd, i), (char *)pObj->pData );
    // build primary outputs for the cofactors
    Vec_PtrForEachEntry( DdNode *, vCofs, bFunc, i )
    {
        if ( bFunc == Cudd_ReadLogicZero(dd) )
            continue;
        pObj = Aig_NodeBddToMuxes_rec( dd, Cudd_Regular(bFunc), pNew, tBdd2Node );
        pObj = Aig_NotCond( pObj, Cudd_IsComplement(bFunc) );
        Aig_ObjCreateCo( pNew, pObj );
    }
    st__free_table( tBdd2Node );

    // duplicate the rest of the AIG
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
    {
        if ( i == 0 )
            continue;
        Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManConvertBddsToAigs(): The check has failed.\n" );
    return pNew;
}